

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeCompare(Parse *pParse,Expr *pLeft,Expr *pRight,int opcode,int in1,int in2,int dest,
               int jumpIfNull,int isCommuted)

{
  byte bVar1;
  uint uVar2;
  Expr *pExpr1;
  int in_EDX;
  long in_RDI;
  undefined4 in_R9D;
  CollSeq *p4;
  int addr;
  int p5;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc8;
  int op;
  int local_4;
  
  op = -0x55555556;
  if (*(int *)(in_RDI + 0x34) == 0) {
    if (p5 == 0) {
      pExpr1 = (Expr *)sqlite3BinaryCompareCollSeq
                                 ((Parse *)CONCAT44(in_R9D,0xaaaaaaaa),
                                  (Expr *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8),
                                  (Expr *)&DAT_aaaaaaaaaaaaaaaa);
    }
    else {
      pExpr1 = (Expr *)sqlite3BinaryCompareCollSeq
                                 ((Parse *)CONCAT44(in_R9D,0xaaaaaaaa),
                                  (Expr *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8),
                                  (Expr *)&DAT_aaaaaaaaaaaaaaaa);
    }
    bVar1 = binaryCompareP5(pExpr1,(Expr *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8),0);
    uVar2 = (uint)bVar1;
    local_4 = sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_R9D,uVar2),op,in_stack_ffffffffffffffc8,
                                (int)((ulong)pExpr1 >> 0x20),(int)pExpr1,
                                (char *)CONCAT44(in_stack_ffffffffffffffbc,0xfffffffe),in_EDX);
    sqlite3VdbeChangeP5(*(Vdbe **)(in_RDI + 0x10),(u16)uVar2);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int codeCompare(
  Parse *pParse,    /* The parsing (and code generating) context */
  Expr *pLeft,      /* The left operand */
  Expr *pRight,     /* The right operand */
  int opcode,       /* The comparison opcode */
  int in1, int in2, /* Register holding operands */
  int dest,         /* Jump here if true.  */
  int jumpIfNull,   /* If true, jump if either operand is NULL */
  int isCommuted    /* The comparison has been commuted */
){
  int p5;
  int addr;
  CollSeq *p4;

  if( pParse->nErr ) return 0;
  if( isCommuted ){
    p4 = sqlite3BinaryCompareCollSeq(pParse, pRight, pLeft);
  }else{
    p4 = sqlite3BinaryCompareCollSeq(pParse, pLeft, pRight);
  }
  p5 = binaryCompareP5(pLeft, pRight, jumpIfNull);
  addr = sqlite3VdbeAddOp4(pParse->pVdbe, opcode, in2, dest, in1,
                           (void*)p4, P4_COLLSEQ);
  sqlite3VdbeChangeP5(pParse->pVdbe, (u16)p5);
  return addr;
}